

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack18_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x3ffff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x12;
  out[1] = uVar1 >> 0x12 | (uVar2 & 0xf) << 0xe;
  uVar1 = in[2];
  out[2] = uVar2 >> 4 & 0x3ffff;
  out[3] = uVar2 >> 0x16;
  out[3] = uVar2 >> 0x16 | (uVar1 & 0xff) << 10;
  out[4] = uVar1 >> 8 & 0x3ffff;
  out[5] = uVar1 >> 0x1a;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x1a | (uVar2 & 0xfff) << 6;
  out[6] = uVar2 >> 0xc & 0x3ffff;
  out[7] = uVar2 >> 0x1e;
  uVar1 = in[4];
  uVar3 = in[5];
  out[7] = uVar2 >> 0x1e | (uVar1 & 0xffff) << 2;
  out[8] = uVar1 >> 0x10;
  out[8] = uVar1 >> 0x10 | (uVar3 & 3) << 0x10;
  out[9] = uVar3 >> 2 & 0x3ffff;
  out[10] = uVar3 >> 0x14;
  uVar1 = in[6];
  out[10] = uVar3 >> 0x14 | (uVar1 & 0x3f) << 0xc;
  out[0xb] = uVar1 >> 6 & 0x3ffff;
  out[0xc] = uVar1 >> 0x18;
  uVar2 = in[7];
  out[0xc] = uVar1 >> 0x18 | (uVar2 & 0x3ff) << 8;
  out[0xd] = uVar2 >> 10 & 0x3ffff;
  out[0xe] = uVar2 >> 0x1c;
  uVar1 = in[8];
  out[0xe] = uVar2 >> 0x1c | (uVar1 & 0x3fff) << 4;
  out[0xf] = uVar1 >> 0xe;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack18_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;

  return in;
}